

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

void __thiscall PhPacker_Arg_E_Test::~PhPacker_Arg_E_Test(PhPacker_Arg_E_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(PhPacker, Arg_E)
{
   std::string str = PhPacker::pack<double>('E', 123.234);
   double result = std::any_cast<double>(PhPacker::unpack('E', str));
   double expected = 123.234;
   GTEST_ASSERT_EQ(result, expected);

   str = PhPacker::pack<double>('E', 65232213123.123);
   result = std::any_cast<double>(PhPacker::unpack('E', str));
   expected = 65232213123.123;
   GTEST_ASSERT_EQ(result, expected);
}